

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddGlobalLinkInformation(cmMakefile *this,cmTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  cmTargetLinkLibraryType llt;
  pointer pbVar4;
  string_view arg;
  allocator<char> local_c9;
  cmMakefile *local_c8;
  string libraryName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  _Optional_payload_base<cmListFileBacktrace> local_88;
  string local_70;
  string local_50;
  
  local_c8 = this;
  TVar2 = cmTarget::GetType(target);
  if (2 < TVar2 - UTILITY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&libraryName,"LINK_LIBRARIES",(allocator<char> *)&local_70);
    cVar3 = GetProperty(local_c8,&libraryName);
    std::__cxx11::string::~string((string *)&libraryName);
    if (cVar3.Value != (string *)0x0) {
      arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar3.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&linkLibs,arg,false);
      for (pbVar4 = linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 != linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
        std::__cxx11::string::string((string *)&libraryName,(string *)pbVar4);
        bVar1 = std::operator==(&libraryName,"optimized");
        if (bVar1) {
          pbVar4 = pbVar4 + 1;
          std::__cxx11::string::_M_assign((string *)&libraryName);
          llt = OPTIMIZED_LibraryType;
        }
        else {
          bVar1 = std::operator==(&libraryName,"debug");
          llt = GENERAL_LibraryType;
          if (bVar1) {
            pbVar4 = pbVar4 + 1;
            std::__cxx11::string::_M_assign((string *)&libraryName);
            llt = DEBUG_LibraryType;
          }
        }
        cmTarget::AddLinkLibrary(target,local_c8,&libraryName,llt);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"INTERFACE_LINK_LIBRARIES",&local_c9);
        cmTarget::GetDebugGeneratorExpressions(&local_50,target,&libraryName,llt);
        local_88._M_engaged = false;
        cmTarget::AppendProperty
                  (target,&local_70,&local_50,(optional<cmListFileBacktrace> *)&local_88,false);
        std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_88);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&libraryName);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&linkLibs);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddGlobalLinkInformation(cmTarget& target)
{
  // for these targets do not add anything
  switch (target.GetType()) {
    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
      return;
    default:;
  }

  if (cmValue linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs = cmExpandedList(*linkLibsProp);

    for (auto j = linkLibs.begin(); j != linkLibs.end(); ++j) {
      std::string libraryName = *j;
      cmTargetLinkLibraryType libType = GENERAL_LibraryType;
      if (libraryName == "optimized") {
        libType = OPTIMIZED_LibraryType;
        ++j;
        libraryName = *j;
      } else if (libraryName == "debug") {
        libType = DEBUG_LibraryType;
        ++j;
        libraryName = *j;
      }
      // This is equivalent to the target_link_libraries plain signature.
      target.AddLinkLibrary(*this, libraryName, libType);
      target.AppendProperty(
        "INTERFACE_LINK_LIBRARIES",
        target.GetDebugGeneratorExpressions(libraryName, libType));
    }
  }
}